

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

bool ParseInt32(string_view str,int32_t *out)

{
  undefined1 auVar1 [16];
  bool bVar2;
  optional<int> oVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  string_view str_00;
  string_view local_20;
  long local_10;
  
  pcVar4 = str._M_str;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = str;
  if (str._M_len < 2) {
    if (str._M_len == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pcVar4;
      str_00 = (string_view)(auVar1 << 0x40);
    }
    else {
      if (*pcVar4 == '+') goto LAB_00af2d82;
      str_00._M_str = pcVar4;
      str_00._M_len = 1;
    }
  }
  else {
    str_00 = str;
    if (*pcVar4 == '+') {
      if (pcVar4[1] == '-') {
        bVar2 = false;
        goto LAB_00af2dcb;
      }
LAB_00af2d82:
      str_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_20,1,0xffffffffffffffff);
    }
  }
  oVar3 = ToIntegral<int>(str_00);
  bVar2 = SUB81(((ulong)oVar3.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int> & 0x100000000) >> 0x20,0);
  if ((out != (int32_t *)0x0) &&
     (((ulong)oVar3.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> & 0x100000000) != 0)) {
    *out = oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
    bVar2 = true;
  }
LAB_00af2dcb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseInt32(std::string_view str, int32_t* out)
{
    return ParseIntegral<int32_t>(str, out);
}